

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_collapse.c
# Opt level: O2

REF_STATUS ref_collapse_edge(REF_GRID ref_grid,REF_INT node0,REF_INT node1)

{
  REF_CELL pRVar1;
  uint uVar2;
  undefined8 uVar3;
  char *pcVar4;
  long lVar5;
  REF_INT ncell;
  REF_INT cell_to_collapse [100];
  
  pRVar1 = ref_grid->cell[8];
  uVar2 = ref_cell_list_with2(pRVar1,node0,node1,100,&ncell,cell_to_collapse);
  if (uVar2 == 0) {
    lVar5 = 0;
    do {
      if (ncell <= lVar5) {
        uVar2 = ref_cell_replace_node(pRVar1,node1,node0);
        if (uVar2 != 0) {
          pcVar4 = "replace node";
          uVar3 = 0x154;
          goto LAB_001ab4f0;
        }
        pRVar1 = ref_grid->cell[3];
        uVar2 = ref_cell_list_with2(pRVar1,node0,node1,100,&ncell,cell_to_collapse);
        if (uVar2 == 0) {
          lVar5 = 0;
          goto LAB_001ab33f;
        }
        pcVar4 = "lst";
        uVar3 = 0x159;
        goto LAB_001ab4f0;
      }
      uVar2 = ref_cell_remove(pRVar1,cell_to_collapse[lVar5]);
      lVar5 = lVar5 + 1;
    } while (uVar2 == 0);
    pcVar4 = "remove";
    uVar3 = 0x152;
  }
  else {
    pcVar4 = "lst";
    uVar3 = 0x14e;
  }
  goto LAB_001ab4f0;
  while( true ) {
    uVar2 = ref_cell_remove(pRVar1,cell_to_collapse[lVar5]);
    lVar5 = lVar5 + 1;
    if (uVar2 != 0) break;
LAB_001ab33f:
    if (ncell <= lVar5) {
      uVar2 = ref_cell_replace_node(pRVar1,node1,node0);
      if (uVar2 != 0) {
        pcVar4 = "replace node";
        uVar3 = 0x15f;
        goto LAB_001ab4f0;
      }
      pRVar1 = ref_grid->cell[0];
      uVar2 = ref_cell_list_with2(pRVar1,node0,node1,100,&ncell,cell_to_collapse);
      if (uVar2 == 0) {
        lVar5 = 0;
        goto LAB_001ab40b;
      }
      pcVar4 = "lst";
      uVar3 = 0x164;
      goto LAB_001ab4f0;
    }
  }
  pcVar4 = "remove";
  uVar3 = 0x15d;
  goto LAB_001ab4f0;
  while( true ) {
    uVar2 = ref_cell_remove(pRVar1,cell_to_collapse[lVar5]);
    lVar5 = lVar5 + 1;
    if (uVar2 != 0) break;
LAB_001ab40b:
    if (ncell <= lVar5) {
      uVar2 = ref_cell_replace_node(pRVar1,node1,node0);
      if (uVar2 == 0) {
        uVar2 = ref_node_remove(ref_grid->node,node1);
        if (uVar2 == 0) {
          uVar2 = ref_geom_remove_all(ref_grid->geom,node1);
          if (uVar2 == 0) {
            return 0;
          }
          pcVar4 = "rm";
          uVar3 = 0x16d;
        }
        else {
          pcVar4 = "rm";
          uVar3 = 0x16c;
        }
      }
      else {
        pcVar4 = "replace node";
        uVar3 = 0x16a;
      }
      goto LAB_001ab4f0;
    }
  }
  pcVar4 = "remove";
  uVar3 = 0x168;
LAB_001ab4f0:
  printf("%s: %d: %s: %d %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_collapse.c",uVar3,
         "ref_collapse_edge",(ulong)uVar2,pcVar4);
  return uVar2;
}

Assistant:

REF_FCN REF_STATUS ref_collapse_edge(REF_GRID ref_grid, REF_INT node0,
                                     REF_INT node1)
/*                               keep node0,  remove node1 */
{
  REF_CELL ref_cell;
  REF_INT cell;
  REF_INT ncell, cell_in_list;
  REF_INT cell_to_collapse[MAX_CELL_COLLAPSE];

  ref_cell = ref_grid_tet(ref_grid);
  RSS(ref_cell_list_with2(ref_cell, node0, node1, MAX_CELL_COLLAPSE, &ncell,
                          cell_to_collapse),
      "lst");

  for (cell_in_list = 0; cell_in_list < ncell; cell_in_list++) {
    cell = cell_to_collapse[cell_in_list];
    RSS(ref_cell_remove(ref_cell, cell), "remove");
  }
  RSS(ref_cell_replace_node(ref_cell, node1, node0), "replace node");

  ref_cell = ref_grid_tri(ref_grid);
  RSS(ref_cell_list_with2(ref_cell, node0, node1, MAX_CELL_COLLAPSE, &ncell,
                          cell_to_collapse),
      "lst");

  for (cell_in_list = 0; cell_in_list < ncell; cell_in_list++) {
    cell = cell_to_collapse[cell_in_list];
    RSS(ref_cell_remove(ref_cell, cell), "remove");
  }
  RSS(ref_cell_replace_node(ref_cell, node1, node0), "replace node");

  ref_cell = ref_grid_edg(ref_grid);
  RSS(ref_cell_list_with2(ref_cell, node0, node1, MAX_CELL_COLLAPSE, &ncell,
                          cell_to_collapse),
      "lst");

  for (cell_in_list = 0; cell_in_list < ncell; cell_in_list++) {
    cell = cell_to_collapse[cell_in_list];
    RSS(ref_cell_remove(ref_cell, cell), "remove");
  }
  RSS(ref_cell_replace_node(ref_cell, node1, node0), "replace node");

  RSS(ref_node_remove(ref_grid_node(ref_grid), node1), "rm");
  RSS(ref_geom_remove_all(ref_grid_geom(ref_grid), node1), "rm");

  return REF_SUCCESS;
}